

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

void init_grammer_rules(void)

{
  code *local_878;
  undefined8 local_870;
  undefined4 local_868;
  char *local_860;
  undefined1 local_858;
  undefined8 local_850;
  code *local_848;
  undefined4 local_840;
  char *local_838;
  undefined1 local_830;
  undefined8 local_828;
  code *local_820;
  undefined4 local_818;
  char *local_810;
  undefined1 local_808;
  undefined8 local_800;
  code *local_7f8;
  undefined4 local_7f0;
  char *local_7e8;
  undefined1 local_7e0;
  undefined8 local_7d8;
  code *local_7d0;
  undefined4 local_7c8;
  char *local_7c0;
  undefined1 local_7b8;
  undefined8 local_7b0;
  code *local_7a8;
  undefined4 local_7a0;
  char *local_798;
  undefined1 local_790;
  undefined8 local_788;
  code *local_780;
  undefined4 local_778;
  char *local_770;
  undefined1 local_768;
  undefined8 local_760;
  code *local_758;
  undefined4 local_750;
  char *local_748;
  undefined1 local_740;
  undefined8 local_738;
  code *local_730;
  undefined4 local_728;
  char *local_720;
  undefined1 local_718;
  undefined8 local_710;
  code *local_708;
  undefined4 local_700;
  char *local_6f8;
  undefined1 local_6f0;
  undefined8 local_6e8;
  code *local_6e0;
  undefined4 local_6d8;
  char *local_6d0;
  undefined1 local_6c8;
  undefined8 local_6c0;
  code *local_6b8;
  undefined4 local_6b0;
  char *local_6a8;
  undefined1 local_6a0;
  undefined8 local_698;
  code *local_690;
  undefined4 local_688;
  undefined8 local_680;
  undefined1 local_678;
  undefined8 local_670;
  code *local_668;
  undefined4 local_660;
  char *local_658;
  undefined1 local_650;
  undefined8 local_648;
  code *local_640;
  undefined4 local_638;
  char *local_630;
  undefined1 local_628;
  undefined8 local_620;
  code *local_618;
  undefined4 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  code *local_5f0;
  undefined4 local_5e8;
  char *local_5e0;
  undefined1 local_5d8;
  undefined8 local_5d0;
  code *local_5c8;
  undefined4 local_5c0;
  char *local_5b8;
  undefined1 local_5b0;
  undefined8 local_5a8;
  code *local_5a0;
  undefined4 local_598;
  char *local_590;
  undefined1 local_588;
  undefined8 local_580;
  code *local_578;
  undefined4 local_570;
  char *local_568;
  undefined1 local_560;
  undefined8 local_558;
  code *local_550;
  undefined4 local_548;
  char *local_540;
  undefined1 local_538;
  undefined8 local_530;
  code *local_528;
  undefined4 local_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_508;
  code *local_500;
  undefined4 local_4f8;
  char *local_4f0;
  undefined1 local_4e8;
  undefined8 local_4e0;
  code *local_4d8;
  undefined4 local_4d0;
  char *local_4c8;
  undefined1 local_4c0;
  undefined8 local_4b8;
  code *local_4b0;
  undefined4 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  code *local_488;
  undefined4 local_480;
  char *local_478;
  undefined1 local_470;
  undefined8 local_468;
  code *local_460;
  undefined4 local_458;
  char *local_450;
  undefined1 local_448;
  code *local_440;
  undefined8 local_438;
  undefined4 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  code *local_410;
  undefined4 local_408;
  char *local_400;
  undefined1 local_3f8;
  undefined8 local_3f0;
  code *local_3e8;
  undefined4 local_3e0;
  char *local_3d8;
  undefined1 local_3d0;
  code *local_3c8;
  code *local_3c0;
  undefined4 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  code *local_3a0;
  code *local_398;
  undefined4 local_390;
  char *local_388;
  undefined1 local_380;
  undefined8 local_378;
  code *local_370;
  undefined4 local_368;
  char *local_360;
  undefined1 local_358;
  undefined8 local_350;
  code *local_348;
  undefined4 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  code *local_320;
  undefined4 local_318;
  char *local_310;
  undefined1 local_308;
  undefined8 local_300;
  code *local_2f8;
  undefined4 local_2f0;
  char *local_2e8;
  undefined1 local_2e0;
  undefined8 local_2d8;
  code *local_2d0;
  undefined4 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  code *local_2a8;
  undefined4 local_2a0;
  char *local_298;
  undefined1 local_290;
  code *local_288;
  undefined8 local_280;
  undefined4 local_278;
  undefined8 local_270;
  undefined1 local_268;
  code *local_260;
  undefined8 local_258;
  undefined4 local_250;
  undefined8 local_248;
  undefined1 local_240;
  code *local_238;
  undefined8 local_230;
  undefined4 local_228;
  undefined8 local_220;
  undefined1 local_218;
  code *local_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined8 local_1f8;
  undefined1 local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  code *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  code *local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined1 local_178;
  code *local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_158;
  undefined1 local_150;
  code *local_148;
  undefined8 local_140;
  undefined4 local_138;
  undefined8 local_130;
  undefined1 local_128;
  code *local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_108;
  undefined1 local_100;
  code *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  code *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  code *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined1 local_88;
  code *local_80;
  code *local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined1 local_60;
  code *local_58;
  code *local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined1 local_38;
  code *local_30;
  code *local_28;
  undefined4 local_20;
  undefined8 local_18;
  undefined1 local_10;
  
  if (!init_grammer_rules::created) {
    init_grammer_rules::created = true;
    local_30 = parse_parentheses_expression;
    local_28 = parse_postfix_call;
    local_20 = 200;
    local_18 = 0;
    local_10 = 0;
    memcpy(rules + 0x52,&local_30,0x28);
    local_58 = parse_list_expression;
    local_50 = parse_postfix_subscript;
    local_48 = 200;
    local_40 = 0;
    local_38 = 0;
    memcpy(rules + 0x57,&local_58,0x28);
    local_80 = parse_literal_expression;
    local_78 = parse_postfix_access;
    local_70 = 200;
    local_68 = 0;
    local_60 = 0;
    memcpy(rules + 0x55,&local_80,0x28);
    local_a8 = parse_function_expression;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_88 = 0;
    memcpy(rules + 0x59,&local_a8,0x28);
    local_d0 = parse_function_expression;
    local_c8 = 0;
    local_c0 = 0;
    local_b8 = 0;
    local_b0 = 0;
    memcpy(rules + 8,&local_d0,0x28);
    local_f8 = parse_identifier_expression;
    local_f0 = 0;
    local_e8 = 0;
    local_e0 = 0;
    local_d8 = 0;
    memcpy(rules + 5,&local_f8,0x28);
    local_120 = parse_literal_expression;
    local_118 = 0;
    local_110 = 0;
    local_108 = 0;
    local_100 = 0;
    memcpy(rules + 3,&local_120,0x28);
    local_148 = parse_literal_expression;
    local_140 = 0;
    local_138 = 0;
    local_130 = 0;
    local_128 = 0;
    memcpy(rules + 4,&local_148,0x28);
    local_170 = parse_keyword_expression;
    local_168 = 0;
    local_160 = 0;
    local_158 = 0;
    local_150 = 0;
    memcpy(rules + 0x28,&local_170,0x28);
    local_198 = parse_keyword_expression;
    local_190 = 0;
    local_188 = 0;
    local_180 = 0;
    local_178 = 0;
    memcpy(rules + 0x2b,&local_198,0x28);
    local_1c0 = parse_keyword_expression;
    local_1b8 = 0;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    memcpy(rules + 0x2a,&local_1c0,0x28);
    local_1e8 = parse_keyword_expression;
    local_1e0 = 0;
    local_1d8 = 0;
    local_1d0 = 0;
    local_1c8 = 0;
    memcpy(rules + 9,&local_1e8,0x28);
    local_210 = parse_file_expression;
    local_208 = 0;
    local_200 = 0;
    local_1f8 = 0;
    local_1f0 = 0;
    memcpy(rules + 0x1b,&local_210,0x28);
    local_238 = parse_keyword_expression;
    local_230 = 0;
    local_228 = 0;
    local_220 = 0;
    local_218 = 0;
    memcpy(rules + 0x27,&local_238,0x28);
    local_260 = parse_keyword_expression;
    local_258 = 0;
    local_250 = 0;
    local_248 = 0;
    local_240 = 0;
    memcpy(rules + 0xb,&local_260,0x28);
    local_288 = parse_keyword_expression;
    local_280 = 0;
    local_278 = 0;
    local_270 = 0;
    local_268 = 0;
    memcpy(rules + 0xc,&local_288,0x28);
    local_2b0 = 0;
    local_2a8 = parse_infix;
    local_2a0 = 0xa0;
    local_298 = "<<";
    local_290 = 0;
    memcpy(rules + 0x2c,&local_2b0,0x28);
    local_2d8 = 0;
    local_2d0 = parse_infix;
    local_2c8 = 0xa0;
    local_2c0 = ">>";
    local_2b8 = 0;
    memcpy(rules + 0x2d,&local_2d8,0x28);
    local_300 = 0;
    local_2f8 = parse_infix;
    local_2f0 = 0x96;
    local_2e8 = "*";
    local_2e0 = 0;
    memcpy(rules + 0x2e,&local_300,0x28);
    local_328 = 0;
    local_320 = parse_infix;
    local_318 = 0x96;
    local_310 = "/";
    local_308 = 0;
    memcpy(rules + 0x2f,&local_328,0x28);
    local_350 = 0;
    local_348 = parse_infix;
    local_340 = 0x96;
    local_338 = "%";
    local_330 = 0;
    memcpy(rules + 0x30,&local_350,0x28);
    local_378 = 0;
    local_370 = parse_infix;
    local_368 = 0x96;
    local_360 = "&";
    local_358 = 0;
    memcpy(rules + 0x31,&local_378,0x28);
    local_3a0 = parse_unary;
    local_398 = parse_infix;
    local_390 = 0x8c;
    local_388 = "+";
    local_380 = 0;
    memcpy(rules + 0x32,&local_3a0,0x28);
    local_3c8 = parse_unary;
    local_3c0 = parse_infix;
    local_3b8 = 0x8c;
    local_3b0 = "-";
    local_3a8 = 0;
    memcpy(rules + 0x33,&local_3c8,0x28);
    local_3f0 = 0;
    local_3e8 = parse_infix;
    local_3e0 = 0x8c;
    local_3d8 = "|";
    local_3d0 = 0;
    memcpy(rules + 0x34,&local_3f0,0x28);
    local_418 = 0;
    local_410 = parse_infix;
    local_408 = 0x8c;
    local_400 = "^";
    local_3f8 = 0;
    memcpy(rules + 0x35,&local_418,0x28);
    local_440 = parse_unary;
    local_438 = 0;
    local_430 = 0;
    local_428 = "~";
    local_420 = 0;
    memcpy(rules + 0x36,&local_440,0x28);
    local_468 = 0;
    local_460 = parse_infix;
    local_458 = 0x87;
    local_450 = "..<";
    local_448 = 0;
    memcpy(rules + 0x37,&local_468,0x28);
    local_490 = 0;
    local_488 = parse_infix;
    local_480 = 0x87;
    local_478 = "...";
    local_470 = 0;
    memcpy(rules + 0x38,&local_490,0x28);
    local_4b8 = 0;
    local_4b0 = parse_infix;
    local_4a8 = 0x84;
    local_4a0 = "is";
    local_498 = 0;
    memcpy(rules + 0x29,&local_4b8,0x28);
    local_4e0 = 0;
    local_4d8 = parse_infix;
    local_4d0 = 0x82;
    local_4c8 = "<";
    local_4c0 = 0;
    memcpy(rules + 0x39,&local_4e0,0x28);
    local_508 = 0;
    local_500 = parse_infix;
    local_4f8 = 0x82;
    local_4f0 = "<=";
    local_4e8 = 0;
    memcpy(rules + 0x3a,&local_508,0x28);
    local_530 = 0;
    local_528 = parse_infix;
    local_520 = 0x82;
    local_518 = ">";
    local_510 = 0;
    memcpy(rules + 0x3b,&local_530,0x28);
    local_558 = 0;
    local_550 = parse_infix;
    local_548 = 0x82;
    local_540 = ">=";
    local_538 = 0;
    memcpy(rules + 0x3c,&local_558,0x28);
    local_580 = 0;
    local_578 = parse_infix;
    local_570 = 0x82;
    local_568 = "==";
    local_560 = 0;
    memcpy(rules + 0x3d,&local_580,0x28);
    local_5a8 = 0;
    local_5a0 = parse_infix;
    local_598 = 0x82;
    local_590 = "!=";
    local_588 = 0;
    memcpy(rules + 0x3e,&local_5a8,0x28);
    local_5d0 = 0;
    local_5c8 = parse_infix;
    local_5c0 = 0x82;
    local_5b8 = "===";
    local_5b0 = 0;
    memcpy(rules + 0x3f,&local_5d0,0x28);
    local_5f8 = 0;
    local_5f0 = parse_infix;
    local_5e8 = 0x82;
    local_5e0 = "!==";
    local_5d8 = 0;
    memcpy(rules + 0x40,&local_5f8,0x28);
    local_620 = 0;
    local_618 = parse_infix;
    local_610 = 0x82;
    local_608 = "~=";
    local_600 = 0;
    memcpy(rules + 0x41,&local_620,0x28);
    local_648 = 0;
    local_640 = parse_infix;
    local_638 = 0x78;
    local_630 = "&&";
    local_628 = 1;
    memcpy(rules + 0x42,&local_648,0x28);
    local_670 = 0;
    local_668 = parse_infix;
    local_660 = 0x6e;
    local_658 = "||";
    local_650 = 1;
    memcpy(rules + 0x43,&local_670,0x28);
    local_698 = 0;
    local_690 = parse_ternary_expression;
    local_688 = 100;
    local_680 = 0;
    local_678 = 0;
    memcpy(rules + 0x44,&local_698,0x28);
    local_6c0 = 0;
    local_6b8 = parse_infix;
    local_6b0 = 0x5a;
    local_6a8 = "=";
    local_6a0 = 0;
    memcpy(rules + 0x45,&local_6c0,0x28);
    local_6e8 = 0;
    local_6e0 = parse_infix;
    local_6d8 = 0x5a;
    local_6d0 = "*=";
    local_6c8 = 0;
    memcpy(rules + 0x46,&local_6e8,0x28);
    local_710 = 0;
    local_708 = parse_infix;
    local_700 = 0x5a;
    local_6f8 = "/=";
    local_6f0 = 0;
    memcpy(rules + 0x47,&local_710,0x28);
    local_738 = 0;
    local_730 = parse_infix;
    local_728 = 0x5a;
    local_720 = "%=";
    local_718 = 0;
    memcpy(rules + 0x48,&local_738,0x28);
    local_760 = 0;
    local_758 = parse_infix;
    local_750 = 0x5a;
    local_748 = "+=";
    local_740 = 0;
    memcpy(rules + 0x49,&local_760,0x28);
    local_788 = 0;
    local_780 = parse_infix;
    local_778 = 0x5a;
    local_770 = "-=";
    local_768 = 0;
    memcpy(rules + 0x4a,&local_788,0x28);
    local_7b0 = 0;
    local_7a8 = parse_infix;
    local_7a0 = 0x5a;
    local_798 = "<<=";
    local_790 = 0;
    memcpy(rules + 0x4b,&local_7b0,0x28);
    local_7d8 = 0;
    local_7d0 = parse_infix;
    local_7c8 = 0x5a;
    local_7c0 = ">>=";
    local_7b8 = 0;
    memcpy(rules + 0x4c,&local_7d8,0x28);
    local_800 = 0;
    local_7f8 = parse_infix;
    local_7f0 = 0x5a;
    local_7e8 = "=&";
    local_7e0 = 0;
    memcpy(rules + 0x4d,&local_800,0x28);
    local_828 = 0;
    local_820 = parse_infix;
    local_818 = 0x5a;
    local_810 = "|=";
    local_808 = 0;
    memcpy(rules + 0x4e,&local_828,0x28);
    local_850 = 0;
    local_848 = parse_infix;
    local_840 = 0x5a;
    local_838 = "^=";
    local_830 = 0;
    memcpy(rules + 0x4f,&local_850,0x28);
    local_878 = parse_unary;
    local_870 = 0;
    local_868 = 0;
    local_860 = "!";
    local_858 = 0;
    memcpy(rules + 0x50,&local_878,0x28);
  }
  return;
}

Assistant:

static void init_grammer_rules (void) {
    static bool created = false;
    if (created) return;
    created = true;

    // rules is a static variable initialized to 0
    // so we automatically have all members initialized to UNUSED

    rules[TOK_OP_OPEN_PARENTHESIS] = RULE(PREC_CALL, parse_parentheses_expression, parse_postfix_call);
    rules[TOK_OP_OPEN_SQUAREBRACKET] = RULE(PREC_CALL, parse_list_expression, parse_postfix_subscript);
    rules[TOK_OP_DOT] = RULE(PREC_CALL, parse_literal_expression, parse_postfix_access);

    rules[TOK_OP_OPEN_CURLYBRACE] = PREFIX(PREC_LOWEST, parse_function_expression);
    rules[TOK_KEY_FUNC] = PREFIX(PREC_LOWEST, parse_function_expression);

    rules[TOK_IDENTIFIER] = PREFIX(PREC_LOWEST, parse_identifier_expression);
    rules[TOK_STRING] = PREFIX(PREC_LOWEST, parse_literal_expression);
    rules[TOK_NUMBER] = PREFIX(PREC_LOWEST, parse_literal_expression);

    rules[TOK_KEY_UNDEFINED] = PREFIX(PREC_LOWEST, parse_keyword_expression);
    rules[TOK_KEY_CURRARGS] = PREFIX(PREC_LOWEST, parse_keyword_expression);
    rules[TOK_KEY_CURRFUNC] = PREFIX(PREC_LOWEST, parse_keyword_expression);
    rules[TOK_KEY_SUPER] = PREFIX(PREC_LOWEST, parse_keyword_expression);
    rules[TOK_KEY_FILE] = PREFIX(PREC_LOWEST, parse_file_expression);
    rules[TOK_KEY_NULL] = PREFIX(PREC_LOWEST, parse_keyword_expression);
    rules[TOK_KEY_TRUE] = PREFIX(PREC_LOWEST, parse_keyword_expression);
    rules[TOK_KEY_FALSE] = PREFIX(PREC_LOWEST, parse_keyword_expression);

    rules[TOK_OP_SHIFT_LEFT] = INFIX_OPERATOR(PREC_SHIFT, "<<");
    rules[TOK_OP_SHIFT_RIGHT] = INFIX_OPERATOR(PREC_SHIFT, ">>");

    rules[TOK_OP_MUL] = INFIX_OPERATOR(PREC_FACTOR, "*");
    rules[TOK_OP_DIV] = INFIX_OPERATOR(PREC_FACTOR, "/");
    rules[TOK_OP_REM] = INFIX_OPERATOR(PREC_FACTOR, "%");
    rules[TOK_OP_BIT_AND] = INFIX_OPERATOR(PREC_FACTOR, "&");
    rules[TOK_OP_ADD] = OPERATOR(PREC_TERM, "+");
    rules[TOK_OP_SUB] = OPERATOR(PREC_TERM, "-");
    rules[TOK_OP_BIT_OR] = INFIX_OPERATOR(PREC_TERM, "|");
    rules[TOK_OP_BIT_XOR] = INFIX_OPERATOR(PREC_TERM, "^");
    rules[TOK_OP_BIT_NOT] = PREFIX_OPERATOR("~");

    rules[TOK_OP_RANGE_EXCLUDED] = INFIX_OPERATOR(PREC_RANGE, "..<");
    rules[TOK_OP_RANGE_INCLUDED] = INFIX_OPERATOR(PREC_RANGE, "...");

    rules[TOK_KEY_ISA] = INFIX_OPERATOR(PREC_ISA, "is");
    rules[TOK_OP_LESS] = INFIX_OPERATOR(PREC_COMPARISON, "<");
    rules[TOK_OP_LESS_EQUAL] = INFIX_OPERATOR(PREC_COMPARISON, "<=");
    rules[TOK_OP_GREATER] = INFIX_OPERATOR(PREC_COMPARISON, ">");
    rules[TOK_OP_GREATER_EQUAL] = INFIX_OPERATOR(PREC_COMPARISON, ">=");
    rules[TOK_OP_ISEQUAL] = INFIX_OPERATOR(PREC_COMPARISON, "==");
    rules[TOK_OP_ISNOTEQUAL] = INFIX_OPERATOR(PREC_COMPARISON, "!=");
    rules[TOK_OP_ISIDENTICAL] = INFIX_OPERATOR(PREC_COMPARISON, "===");
    rules[TOK_OP_ISNOTIDENTICAL] = INFIX_OPERATOR(PREC_COMPARISON, "!==");
    rules[TOK_OP_PATTERN_MATCH] = INFIX_OPERATOR(PREC_COMPARISON, "~=");

    rules[TOK_OP_AND] = INFIX_OPERATOR_RIGHT(PREC_LOGICAL_AND, "&&");
    rules[TOK_OP_OR] = INFIX_OPERATOR_RIGHT(PREC_LOGICAL_OR, "||");
    rules[TOK_OP_TERNARY] = INFIX(PREC_TERNARY, parse_ternary_expression);

    rules[TOK_OP_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "=");
    rules[TOK_OP_MUL_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "*=");
    rules[TOK_OP_DIV_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "/=");
    rules[TOK_OP_REM_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "%=");
    rules[TOK_OP_ADD_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "+=");
    rules[TOK_OP_SUB_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "-=");
    rules[TOK_OP_SHIFT_LEFT_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "<<=");
    rules[TOK_OP_SHIFT_RIGHT_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, ">>=");
    rules[TOK_OP_BIT_AND_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "=&");
    rules[TOK_OP_BIT_OR_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "|=");
    rules[TOK_OP_BIT_XOR_ASSIGN] = INFIX_OPERATOR(PREC_ASSIGN, "^=");

    rules[TOK_OP_NOT] = PREFIX_OPERATOR("!");
}